

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

GLuint glcts::bitCount(GLuint input)

{
  GLuint result;
  
  result = 0;
  for (; input != 0; input = input >> 1) {
    result = result + (input & 1);
  }
  return result;
}

Assistant:

static GLuint bitCount(GLuint input)
{
	GLuint result = 0;
	while (input)
	{
		if (input & 1)
		{
			result += 1;
		}
		input >>= 1;
	}
	return result;
}